

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysextest.cpp
# Opt level: O2

void mycallback(double deltatime,vector<unsigned_char,_std::allocator<unsigned_char>_> *message,
               void *param_3)

{
  ulong uVar1;
  ostream *poVar2;
  byte *pbVar3;
  size_type __n;
  int local_38;
  
  uVar1 = (long)(message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_finish -
          (long)(message->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start;
  for (__n = 0; (uVar1 & 0xffffffff) != __n; __n = __n + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Byte ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," = ");
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(message,__n);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)*pbVar3);
    std::operator<<(poVar2,", ");
  }
  local_38 = (int)uVar1;
  if (local_38 != 0) {
    std::operator<<((ostream *)&std::cout,"stamp = ");
    poVar2 = std::ostream::_M_insert<double>(deltatime);
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  return;
}

Assistant:

void mycallback( double deltatime, std::vector< unsigned char > *message, void * /*userData*/ )
{
  unsigned int nBytes = message->size();
  for ( unsigned int i=0; i<nBytes; i++ )
    std::cout << "Byte " << i << " = " << (int)message->at(i) << ", ";
  if ( nBytes > 0 )
    std::cout << "stamp = " << deltatime << std::endl;
}